

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

void CopyScore(VP8ModeScore *dst,VP8ModeScore *src)

{
  VP8ModeScore *src_local;
  VP8ModeScore *dst_local;
  
  dst->D = src->D;
  dst->SD = src->SD;
  dst->R = src->R;
  dst->H = src->H;
  dst->nz = src->nz;
  dst->score = src->score;
  return;
}

Assistant:

static void CopyScore(VP8ModeScore* WEBP_RESTRICT const dst,
                      const VP8ModeScore* WEBP_RESTRICT const src) {
  dst->D  = src->D;
  dst->SD = src->SD;
  dst->R  = src->R;
  dst->H  = src->H;
  dst->nz = src->nz;      // note that nz is not accumulated, but just copied.
  dst->score = src->score;
}